

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall
cmComputeTargetDepends::cmComputeTargetDepends(cmComputeTargetDepends *this,cmGlobalGenerator *gg)

{
  _Rb_tree_header *p_Var1;
  cmake *pcVar2;
  cmState *pcVar3;
  bool bVar4;
  allocator local_51;
  string local_50;
  
  (this->Targets).
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Targets).
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Targets).
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TargetIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->TargetIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->TargetIndex)._M_t._M_impl.super__Rb_tree_header;
  (this->TargetIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->TargetIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->TargetIndex)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
  super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
  super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
  super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->FinalGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
  super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FinalGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
  super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FinalGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
  super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ComponentHead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ComponentHead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ComponentHead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ComponentTail).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ComponentTail).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ComponentTail).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->GlobalGenerator = gg;
  pcVar2 = gg->CMakeInstance;
  pcVar3 = pcVar2->State;
  std::__cxx11::string::string((string *)&local_50,"GLOBAL_DEPENDS_DEBUG_MODE",&local_51);
  bVar4 = cmState::GetGlobalPropertyAsBool(pcVar3,&local_50);
  this->DebugMode = bVar4;
  std::__cxx11::string::~string((string *)&local_50);
  pcVar3 = pcVar2->State;
  std::__cxx11::string::string((string *)&local_50,"GLOBAL_DEPENDS_NO_CYCLES",&local_51);
  bVar4 = cmState::GetGlobalPropertyAsBool(pcVar3,&local_50);
  this->NoCycles = bVar4;
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

cmComputeTargetDepends::cmComputeTargetDepends(cmGlobalGenerator* gg)
{
  this->GlobalGenerator = gg;
  cmake* cm = this->GlobalGenerator->GetCMakeInstance();
  this->DebugMode = cm->GetState()
                      ->GetGlobalPropertyAsBool("GLOBAL_DEPENDS_DEBUG_MODE");
  this->NoCycles = cm->GetState()
                      ->GetGlobalPropertyAsBool("GLOBAL_DEPENDS_NO_CYCLES");
}